

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.cpp
# Opt level: O1

void __thiscall
charls::jpeg_stream_reader::try_read_spiff_header_segment
          (jpeg_stream_reader *this,spiff_header *header,bool *spiff_header_found)

{
  int *piVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  
  if ((this->segment_data_).size_ < 0x1e) {
    __assert_fail("segment_data_.size() >= 30",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_reader.cpp"
                  ,0x2ba,
                  "void charls::jpeg_stream_reader::try_read_spiff_header_segment(spiff_header &, bool &)"
                 );
  }
  piVar1 = (int *)this->position_;
  if (this->end_position_ < (iterator)((long)piVar1 + 6U)) {
    __assert_fail("position_ + byte_count <= end_position_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_reader.cpp"
                  ,0x264,"const_byte_span charls::jpeg_stream_reader::read_bytes(const size_t)");
  }
  this->position_ = (iterator)((long)piVar1 + 6U);
  if ((short)piVar1[1] == 0x46 && *piVar1 == 0x46495053) {
    bVar2 = read_byte(this);
    if (bVar2 < 3) {
      if (this->end_position_ < this->position_ + 1) {
        __assert_fail("position_ + count <= end_position_",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_reader.h"
                      ,0x4b,"void charls::jpeg_stream_reader::advance_position(const size_t)");
      }
      this->position_ = this->position_ + 1;
      bVar2 = read_byte(this);
      header->profile_id = (uint)bVar2;
      bVar2 = read_byte(this);
      header->component_count = (uint)bVar2;
      uVar4 = read_uint32(this);
      header->height = uVar4;
      uVar4 = read_uint32(this);
      header->width = uVar4;
      bVar2 = read_byte(this);
      header->color_space = (uint)bVar2;
      bVar2 = read_byte(this);
      header->bits_per_sample = (uint)bVar2;
      bVar2 = read_byte(this);
      header->compression_type = (uint)bVar2;
      bVar2 = read_byte(this);
      header->resolution_units = (uint)bVar2;
      uVar4 = read_uint32(this);
      header->vertical_resolution = uVar4;
      uVar4 = read_uint32(this);
      header->horizontal_resolution = uVar4;
      bVar3 = true;
      goto LAB_0012cc09;
    }
  }
  header->color_space = bi_level_black;
  header->bits_per_sample = 0;
  header->compression_type = uncompressed;
  header->resolution_units = aspect_ratio;
  header->profile_id = none;
  header->component_count = 0;
  header->height = 0;
  header->width = 0;
  header->vertical_resolution = 0;
  header->horizontal_resolution = 0;
  bVar3 = false;
LAB_0012cc09:
  *spiff_header_found = bVar3;
  return;
}

Assistant:

USE_DECL_ANNOTATIONS void jpeg_stream_reader::try_read_spiff_header_segment(spiff_header& header, bool& spiff_header_found)
{
    ASSERT(segment_data_.size() >= 30);

    const array<uint8_t, 6> spiff_tag{'S', 'P', 'I', 'F', 'F', 0};
    if (!equal(spiff_tag.cbegin(), spiff_tag.cend(), read_bytes(6).begin()))
    {
        header = {};
        spiff_header_found = false;
        return;
    }

    const auto high_version{read_byte()};
    if (high_version > spiff_major_revision_number)
    {
        header = {};
        spiff_header_found = false;
        return; // Treat unknown versions as if the SPIFF header doesn't exists.
    }
    skip_byte(); // low version

    header.profile_id = static_cast<spiff_profile_id>(read_byte());
    header.component_count = read_uint8();
    header.height = read_uint32();
    header.width = read_uint32();
    header.color_space = static_cast<spiff_color_space>(read_byte());
    header.bits_per_sample = read_uint8();
    header.compression_type = static_cast<spiff_compression_type>(read_byte());
    header.resolution_units = static_cast<spiff_resolution_units>(read_byte());
    header.vertical_resolution = read_uint32();
    header.horizontal_resolution = read_uint32();

    spiff_header_found = true;
}